

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>::
TryUndeleteProperty(SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                    *this,DynamicObject *object,unsigned_short existingPropertyIndex,
                   unsigned_short *propertyIndex)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar6;
  JavascriptString **ppJVar7;
  ushort *propertyIndex_00;
  JavascriptString *local_58;
  JavascriptString *propertyKeyToPreserve;
  JavascriptString *propertyKeyToReuse;
  unsigned_short *puStack_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptorToPreserve;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34 [2];
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptorToReuse;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x5c,"(object)","object");
    if (!bVar2) goto LAB_00e3a324;
    *puVar5 = 0;
  }
  if (propertyIndex == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x5d,"(propertyIndex)","propertyIndex");
    if (!bVar2) goto LAB_00e3a324;
    *puVar5 = 0;
  }
  uVar4 = (uint)existingPropertyIndex;
  this_00 = (this->
            super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>).
            propertyMap.ptr;
  if (this_00->count - this_00->freeCount <= (int)(uint)existingPropertyIndex) {
    return false;
  }
  uVar3 = (uint)existingPropertyIndex;
  pSVar6 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetValueAt(this_00,uVar4);
  if (pSVar6->propertyIndex != existingPropertyIndex) {
    return false;
  }
  pSVar6 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetValueAt((this->
                        super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        ).propertyMap.ptr,uVar3);
  puStack_40 = propertyIndex;
  if (pSVar6->propertyIndex != existingPropertyIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,100,
                                "(this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex)"
                                ,
                                "this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex"
                               );
    if (!bVar2) goto LAB_00e3a324;
    *puVar5 = 0;
  }
  propertyIndex_00 = puStack_40;
  pSVar6 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetValueAt((this->
                        super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        ).propertyMap.ptr,uVar3);
  if ((pSVar6->Attributes & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x65,
                                "(this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & 0x08)"
                                ,
                                "this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & PropertyDeleted"
                               );
    if (!bVar2) goto LAB_00e3a324;
    *puVar5 = 0;
    propertyIndex_00 = puStack_40;
  }
  bVar2 = TryReuseDeletedPropertyIndex(this,object,propertyIndex_00);
  if (bVar2) {
    if (*propertyIndex_00 == existingPropertyIndex) {
      return true;
    }
    ppJVar7 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::GetKeyAt((this->
                         super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                         ).propertyMap.ptr,(uint)*propertyIndex_00);
    local_58 = *ppJVar7;
    pSVar6 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                          ).propertyMap.ptr,(uint)*propertyIndex_00);
    propertyKeyToReuse._4_4_ = CONCAT22(existingPropertyIndex,SUB42(*pSVar6,0));
    ppJVar7 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::GetKeyAt((this->
                         super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                         ).propertyMap.ptr,uVar3);
    propertyKeyToPreserve = *ppJVar7;
    pSVar6 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                          ).propertyMap.ptr,uVar4);
    local_34[0]._0_2_ = SUB42(*pSVar6,0);
    local_34[0].propertyIndex = *propertyIndex_00;
    JsUtil::
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Remove((this->
             super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>).
             propertyMap.ptr,&local_58);
    JsUtil::
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Remove((this->
             super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>).
             propertyMap.ptr,&propertyKeyToPreserve);
    uVar3 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)(this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                          ).propertyMap.ptr,&local_58,
                       (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                       ((long)&propertyKeyToReuse + 4));
    if (uVar3 != uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x86,"(dictionaryIndex == existingPropertyIndex)",
                                  "dictionaryIndex == existingPropertyIndex");
      if (!bVar2) goto LAB_00e3a324;
      *puVar5 = 0;
    }
    uVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)(this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                          ).propertyMap.ptr,&propertyKeyToPreserve,local_34);
    if (uVar4 == *puStack_40) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x88,"(dictionaryIndex == *propertyIndex)",
                                "dictionaryIndex == *propertyIndex");
    if (bVar2) {
      *puVar5 = 0;
      return true;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x6a,"(0)","0");
    if (bVar2) {
      *puVar5 = 0;
      return false;
    }
  }
LAB_00e3a324:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryUndeleteProperty(
        DynamicObject *const object,
        const TPropertyIndex existingPropertyIndex,
        TPropertyIndex *const propertyIndex)
    {
        Assert(object);
        Assert(propertyIndex);

        if(!IsReusablePropertyIndex(existingPropertyIndex))
        {
            return false;
        }

        Assert(this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex);
        Assert(this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & PropertyDeleted);

        const bool reused = TryReuseDeletedPropertyIndex(object, propertyIndex);
        if (!reused)
        {
            Assert(0); // at least one property index must have been free-listed since we're adding an existing deleted property
            return false;
        }

        if(*propertyIndex == existingPropertyIndex)
        {
            // The deleted property index that is being added is the first deleted property index in the free-list
            return true;
        }

        // We're trying to add a deleted property index that is currently somewhere in the middle of the free-list chain. To
        // avoid rebuilding the free-list, swap the property descriptor with the one for the first deleted property index in the
        // free-list. Since we also need to make sure that each descriptor's property index is the same as its dictionary entry
        // index, we need to remove them from the dictionary and add them back in the same order, which actually adds them in
        // reverse order. This relies on the fact that BaseDictionary first reuses the last-deleted entry index in its
        // free-listing strategy. Should remove this dependence in the future.

        TMapKey propertyKeyToPreserve = this->propertyMap->GetKeyAt(*propertyIndex);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptorToPreserve = this->propertyMap->GetValueAt(*propertyIndex);
        descriptorToPreserve.propertyIndex = existingPropertyIndex;

        TMapKey propertyKeyToReuse = this->propertyMap->GetKeyAt(existingPropertyIndex);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptorToReuse = this->propertyMap->GetValueAt(existingPropertyIndex);
        descriptorToReuse.propertyIndex = *propertyIndex;

        this->propertyMap->Remove(propertyKeyToPreserve);
        this->propertyMap->Remove(propertyKeyToReuse);
        int dictionaryIndex = this->propertyMap->Add(propertyKeyToPreserve, descriptorToPreserve);
        Assert(dictionaryIndex == existingPropertyIndex);
        dictionaryIndex = this->propertyMap->Add(propertyKeyToReuse, descriptorToReuse);
        Assert(dictionaryIndex == *propertyIndex);

        return true;
    }